

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week14-app2.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  allocator_type aVar1;
  bool bVar2;
  int *piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pcVar8;
  uint uVar9;
  ostream *poVar10;
  long *plVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  ulong uVar13;
  vector<char,_std::allocator<char>_> *pvVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  double *pdVar21;
  allocator_type *paVar22;
  initializer_list<double> __l;
  initializer_list<char> __l_00;
  initializer_list<short> __l_01;
  initializer_list<int> __l_02;
  facade_iterator_t<ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>_>_>,_ranges::ref_view<std::vector<char>_>_>_>
  __begin1;
  vector<double> v1;
  vector<short> v;
  vector<char> v2;
  allocator_type local_a9;
  vector<int,_std::allocator<int>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<short,_std::allocator<short>_> local_78;
  vector<double,_std::allocator<double>_> *pvStack_60;
  ulong local_58;
  double local_50;
  vector<char,_std::allocator<char>_> local_48;
  
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4025000000000000;
  pvStack_60 = (vector<double,_std::allocator<double>_> *)0x403419999999999a;
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x40091eb851eb851f;
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x400599999999999a;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_78;
  std::vector<double,_std::allocator<double>_>::vector(&local_90,__l,(allocator_type *)&local_48);
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT35(local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                               super__Vector_impl_data._M_start._5_3_,0x3131303131);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_78;
  std::vector<char,_std::allocator<char>_>::vector(&local_48,__l_00,(allocator_type *)&local_a8);
  uVar19 = (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  uVar13 = 2;
  if (uVar19 < 2) {
    uVar13 = uVar19;
  }
  if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_50 = 0.0;
  }
  else {
    local_50 = 0.0;
    lVar17 = 0;
    do {
      local_50 = local_50 +
                 *(double *)
                  ((long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar17 + -8);
      lVar17 = lVar17 + -8;
    } while (-lVar17 != uVar13 * 8);
  }
  poVar10 = std::ostream::_M_insert<double>(local_50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  poVar10 = std::ostream::_M_insert<double>(local_50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  pcVar8 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar7 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(&local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start)
                [local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish];
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_78;
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&local_48;
  pvStack_60 = &local_90;
  while ((piVar6 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
         piVar5 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish,
         local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish != (pointer)pcVar8 ||
         ((pointer)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage != pdVar7))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    poVar10 = std::ostream::_M_insert<double>(*(double *)((long)piVar6 + -8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
    local_a9 = *(allocator_type *)piVar5;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_a9,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    ranges::
    cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,std::allocator<double>>>>,ranges::ref_view<std::vector<char,std::allocator<char>>>>
    ::cursor<false>::next_<2ul>((cursor<false> *)&local_a8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  uVar9 = (int)((ulong)((long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) - 1;
  if (-1 < (int)uVar9) {
    local_58 = (ulong)uVar9;
    do {
      if ((allocator_type *)
          (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1) !=
          (allocator_type *)
          local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_50 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[local_58];
        paVar22 = (allocator_type *)0x0;
        do {
          aVar1 = *(allocator_type *)
                   (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)paVar22);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
          poVar10 = std::ostream::_M_insert<double>(local_50);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
          local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT71(local_78.super__Vector_base<short,_std::allocator<short>_>.
                                        _M_impl.super__Vector_impl_data._M_start._1_7_,aVar1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_78,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          paVar22 = paVar22 + 1;
        } while (paVar22 < (allocator_type *)
                           (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish +
                           ~(ulong)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start));
      }
      uVar13 = local_58 - 1;
      bVar2 = 0 < (long)local_58;
      local_58 = uVar13;
    } while (bVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_1000000010001;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT62(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish._2_6_,1);
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)&local_a8;
  std::vector<short,_std::allocator<short>_>::vector(&local_78,__l_01,&local_a9);
  iVar18 = 0;
  if (local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    iVar16 = 1;
    pvVar14 = (vector<char,_std::allocator<char>_> *)
              local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      iVar20 = *(short *)((long)&pvVar14[-1].super__Vector_base<char,_std::allocator<char>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage + 6) * iVar16;
      iVar16 = iVar16 * 2;
      pvVar14 = (vector<char,_std::allocator<char>_> *)
                ((long)&pvVar14[-1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 6);
      iVar18 = iVar18 + iVar20;
    } while (pvVar14 !=
             (vector<char,_std::allocator<char>_> *)
             local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  plVar11 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar18);
  std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
  std::ostream::put((char)plVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  uVar9 = (int)((ulong)((long)local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 1) - 1;
  if ((int)uVar9 < 0) {
    iVar18 = 0;
  }
  else {
    iVar18 = 0;
    iVar16 = 1;
    lVar17 = (ulong)uVar9 + 1;
    do {
      iVar18 = iVar18 + *(short *)((long)local_78.super__Vector_base<short,_std::allocator<short>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar17 * 2 + -2)
                        * iVar16;
      iVar16 = iVar16 * 2;
      lVar15 = lVar17 + -1;
      bVar2 = 0 < lVar17;
      lVar17 = lVar15;
    } while (lVar15 != 0 && bVar2);
  }
  plVar11 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar18);
  std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
  std::ostream::put((char)plVar11);
  std::ostream::flush();
  if ((vector<char,_std::allocator<char>_> *)
      local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (vector<char,_std::allocator<char>_> *)0x0) {
    operator_delete(local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  ranges::sort_fn::
  operator()<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::less,_ranges::identity>
            ((sort_fn *)&ranges::sort,
             local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  for (pdVar21 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pdVar21 !=
      local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish; pdVar21 = pdVar21 + 1) {
    poVar10 = std::ostream::_M_insert<double>(*pdVar21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1400000005;
  pvStack_60 = (vector<double,_std::allocator<double>_> *)0xa00000005;
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xa0000000a;
  local_78.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x500000005;
  __l_02._M_len = 8;
  __l_02._M_array = (iterator)&local_78;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l_02,(allocator_type *)&local_a9);
  _Var12 = ranges::unique_fn::
           operator()<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::equal_to,_ranges::identity>
                     ((unique_fn *)&ranges::unique,
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  piVar3 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  _Var4._M_current =
       local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (_Var12._M_current !=
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    _Var4 = _Var12;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)_Var12;
  }
  for (; piVar5 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish,
      piVar3 != local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = _Var4._M_current;
    plVar11 = (long *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    std::ostream::put((char)plVar11);
    std::ostream::flush();
    _Var4._M_current =
         local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = piVar5;
  }
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       _Var4._M_current;
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((allocator_type *)
      local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (allocator_type *)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int, char* [])
{
    auto horizontal_line = [] { std::cout << "------" << std::endl; };
    auto new_line = [] { std::cout << std::endl; };

    auto v1 = vector<double>{3.14, 2.7, 10.5, 20.1};
    auto v2 = vector<char>{'1', '1', '0', '1', '1'};

    { // example #1: accumulate
        // below is a single for loop implementation summing things up
        auto sum1 = accumulate(v1 | views::reverse | views::take(2), 0.0);
        std::cout << sum1 << std::endl;

        horizontal_line();

        // this is the old-school way of writing it
        auto sum2 = 0.0;
        for(size_t i=v1.size()-1; i>=v1.size()-1-2; --i)
            sum2 += v1[i];
        std::cout << sum1 << std::endl;
    }
    new_line();

    { // example #2: nested-for-loop implementation with ranges
        // below is a nested-for-loop equivalent of going over v1 and v2.
        // nesting is actually equivalent to taking cartesian_product in mathematics
        for(auto [a, b] : views::cartesian_product(v1 | views::reverse, v2))
            std::cout << "[" << a << ", " << b << "]" << std::endl;

        horizontal_line();

        // this is the old-school nested for loop version! very prone to bugs.
        for(int i=v1.size()-1; i>=0; --i)
        {
            auto a = v1[i];
            for(size_t j=0; j<v2.size()-1; ++j)
            {
                auto b = v2[j];
                std::cout << "[" << a << ", " << b << "]" << std::endl;
            }
        }
    }
    new_line();

    { // example #3: inner-product (dot-product) -> single for-loop coupled with some other action

        // this is a generator that returns 1, k^1, k^2, k^3, k^4, ... respectively for each call
        auto powers_of_k = [](auto k) {
            return [i=1, k]() mutable { return (i*=k)/k; };
        };

        // make it a ranges-library compatible generator that generate 1, 2, 4, 8, 16, ...
        auto multiples_of_2 = views::generate(powers_of_k(2));

        auto v = vector<short>{1, 1, 0, 1, 1}; // base 10 repr. of binary number: 1*1 + 2*1 + 4*0 + 8*1 + 16*1

        auto result = inner_product(v | views::reverse, multiples_of_2, 0);
        std::cout << result << std::endl;

        horizontal_line();

        // this is the old-school version! very prone to bugs.
        auto sum = 0;
        auto k = 1;
        for(int i=v.size()-1; i>=0; --i)
        {
            sum += k * v[i];
            k *= 2;
        }
        std::cout << sum << std::endl;
    }
    new_line();

    // you can easily sort things with ranges library
    {
        v1 |= actions::sort;
        for(auto a : v1)
            std::cout << a << std::endl;
    }
    new_line();

    // you can easily get non-repeating (unique) elements with ranges library
    {
        auto v = vector<int>{10, 10, 5, 5, 5, 20, 5, 10};
        v |= actions::unique; // produces 10, 5, 20, 5, 10
        for(auto a : v)
            std::cout << a << std::endl;
    }
    return 0;
}